

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

void __thiscall
icu_63::UnicodeString::UnicodeString
          (UnicodeString *this,UBool isTerminated,ConstChar16Ptr *textPtr,int32_t textLength)

{
  UChar *s;
  ushort uVar1;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_00249818
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 8;
  s = textPtr->p_;
  if (s == (UChar *)0x0) {
    (this->fUnion).fStackFields.fLengthAndFlags = 2;
    return;
  }
  if ((textLength < -1) || (isTerminated == '\0' && textLength == -1)) {
LAB_00182e4f:
    setToBogus(this);
  }
  else {
    if (textLength == -1 || isTerminated == '\0') {
      uVar1 = 8;
      if (textLength == -1) {
        textLength = u_strlen_63(s);
        uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      }
    }
    else {
      if (s[(uint)textLength] != L'\0') goto LAB_00182e4f;
      uVar1 = 8;
    }
    if (textLength < 0x400) {
      uVar1 = (ushort)(textLength << 5) | uVar1 & 0x1f;
    }
    else {
      uVar1 = uVar1 | 0xffe0;
      (this->fUnion).fFields.fLength = textLength;
    }
    (this->fUnion).fStackFields.fLengthAndFlags = uVar1;
    (this->fUnion).fFields.fArray = s;
    (this->fUnion).fFields.fCapacity = (textLength + 1) - (uint)(isTerminated == '\0');
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(UBool isTerminated,
                             ConstChar16Ptr textPtr,
                             int32_t textLength) {
  fUnion.fFields.fLengthAndFlags = kReadonlyAlias;
  const UChar *text = textPtr;
  if(text == NULL) {
    // treat as an empty string, do not alias
    setToEmpty();
  } else if(textLength < -1 ||
            (textLength == -1 && !isTerminated) ||
            (textLength >= 0 && isTerminated && text[textLength] != 0)
  ) {
    setToBogus();
  } else {
    if(textLength == -1) {
      // text is terminated, or else it would have failed the above test
      textLength = u_strlen(text);
    }
    setArray(const_cast<UChar *>(text), textLength,
             isTerminated ? textLength + 1 : textLength);
  }
}